

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_remove_input(wally_tx *tx,size_t index)

{
  _Bool _Var1;
  wally_tx_input *input_00;
  wally_tx_input *input;
  size_t index_local;
  wally_tx *tx_local;
  
  _Var1 = is_valid_tx(tx);
  if ((_Var1) && (index < tx->num_inputs)) {
    input_00 = tx->inputs + index;
    tx_input_free(input_00,false);
    if (index != tx->num_inputs - 1) {
      memmove(input_00,input_00 + 1,((tx->num_inputs - index) + -1) * 0xd0);
    }
    wally_clear(tx->inputs + (tx->num_inputs - 1),0xd0);
    tx->num_inputs = tx->num_inputs - 1;
    tx_local._4_4_ = 0;
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_remove_input(struct wally_tx *tx, size_t index)
{
    struct wally_tx_input *input;

    if (!is_valid_tx(tx) || index >= tx->num_inputs)
        return WALLY_EINVAL;

    input = tx->inputs + index;
    tx_input_free(input, false);
    if (index != tx->num_inputs - 1)
        memmove(input, input + 1,
                (tx->num_inputs - index - 1) * sizeof(*input));
    wally_clear(tx->inputs + tx->num_inputs - 1, sizeof(*input));

    tx->num_inputs -= 1;
    return WALLY_OK;
}